

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

Abc_Cex_t * Bmc_CexInnerStates(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t **ppCexImpl,int fVerbose)

{
  Abc_Cex_t *pCex_00;
  Abc_Cex_t *pCex_01;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x18a,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  iVar4 = 0;
  pCex_00 = Abc_CexAlloc(0,p->vCis->nSize,pCex->iFrame + 1);
  iVar14 = pCex->iFrame;
  pCex_00->iFrame = iVar14;
  pCex_00->iPo = pCex->iPo;
  pCex_01 = Abc_CexAlloc(0,p->vCis->nSize,iVar14 + 1);
  iVar14 = pCex->iFrame;
  pCex_01->iPo = pCex->iPo;
  pCex_01->iFrame = iVar14;
  Gia_ManCleanMark01(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  while ((iVar4 < p->nRegs &&
         (pGVar1 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar4), pGVar1 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xbfffffffbfffffff | 0x4000000000000000;
    iVar4 = iVar4 + 1;
  }
  iVar14 = pCex->nRegs;
  for (iVar4 = 0; iVar4 <= pCex->iFrame; iVar4 = iVar4 + 1) {
    iVar6 = 0;
    while ((iVar5 = iVar14 + iVar6, iVar6 < p->vCis->nSize - p->nRegs &&
           (pGVar1 = Gia_ManCi(p,iVar6), pGVar1 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar1 =
           *(ulong *)pGVar1 & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[iVar5 >> 5] >> ((byte)iVar5 & 0x1f) & 1) << 0x1e);
      iVar6 = iVar6 + 1;
    }
    iVar14 = 0;
    while (((iVar14 < p->nRegs &&
            (pGVar1 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar14), pGVar1 != (Gia_Obj_t *)0x0)
            ) && (pGVar2 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar14),
                 pGVar2 != (Gia_Obj_t *)0x0))) {
      uVar3 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x40000000);
      uVar12 = *(ulong *)pGVar2;
      *(ulong *)pGVar2 = uVar12 & 0xffffffffbfffffff | uVar3;
      *(ulong *)pGVar2 = uVar12 & 0xbfffffffbfffffff | uVar3 | *(ulong *)pGVar1 & 0x4000000000000000
      ;
      iVar14 = iVar14 + 1;
    }
    iVar14 = 0;
    while ((iVar14 < p->vCis->nSize && (pGVar1 = Gia_ManCi(p,iVar14), pGVar1 != (Gia_Obj_t *)0x0)))
    {
      uVar12 = *(ulong *)pGVar1;
      if (((uint)uVar12 >> 0x1e & 1) != 0) {
        iVar6 = pCex_00->nPis * iVar4 + iVar14;
        (&pCex_00[1].iPo)[iVar6 >> 5] = (&pCex_00[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
        uVar12 = *(ulong *)pGVar1;
      }
      if ((uVar12 & 0x4000000000000000) != 0) {
        iVar6 = pCex_01->nPis * iVar4 + iVar14;
        (&pCex_01[1].iPo)[iVar6 >> 5] = (&pCex_01[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
      }
      iVar14 = iVar14 + 1;
    }
    iVar14 = 0;
    while ((iVar14 < p->nObjs && (pGVar1 = Gia_ManObj(p,iVar14), pGVar1 != (Gia_Obj_t *)0x0))) {
      uVar12 = *(ulong *)pGVar1;
      uVar3 = uVar12 & 0x1fffffff;
      if (uVar3 != 0x1fffffff && -1 < (int)uVar12) {
        pGVar2 = pGVar1 + -uVar3;
        uVar9 = (uint)(uVar12 >> 0x1d) & 7 ^ *(uint *)(pGVar1 + -uVar3) >> 0x1e;
        uVar11 = (uint)(uVar12 >> 0x20);
        uVar3 = (ulong)(uVar11 & 0x1fffffff);
        pGVar7 = pGVar1 + -uVar3;
        uVar10 = *(uint *)(pGVar1 + -uVar3) >> 0x1e & 1;
        uVar11 = uVar11 >> 0x1d & 1;
        uVar13 = (uVar10 ^ uVar11) & uVar9;
        uVar3 = (ulong)(uVar13 << 0x1e);
        *(ulong *)pGVar1 = uVar12 & 0xffffffff3fffffff | uVar3;
        if (uVar13 == 0) {
          if (((uVar9 & 1) == 0) && (uVar10 == uVar11)) {
            uVar12 = uVar12 & 0xbfffffff3fffffff |
                     (*(ulong *)pGVar7 | *(ulong *)pGVar2) & 0x4000000000000000;
          }
          else {
            if ((uVar9 & 1) == 0) {
              uVar3 = *(ulong *)pGVar2;
            }
            else {
              if (uVar10 != uVar11) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                              ,0x1bc,
                              "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)"
                             );
              }
              uVar3 = *(ulong *)pGVar7;
            }
            uVar12 = uVar12 & 0xbfffffff3fffffff | uVar3 & 0x4000000000000000;
          }
        }
        else {
          uVar12 = uVar12 & 0xbfffffff3fffffff | uVar3 |
                   *(ulong *)pGVar2 & 0x4000000000000000 & *(ulong *)pGVar7;
        }
        *(ulong *)pGVar1 = uVar12;
      }
      iVar14 = iVar14 + 1;
    }
    iVar14 = 0;
    while ((iVar14 < p->vCos->nSize && (pGVar1 = Gia_ManCo(p,iVar14), pGVar1 != (Gia_Obj_t *)0x0)))
    {
      uVar12 = *(ulong *)pGVar1;
      uVar3 = (ulong)((uint)uVar12 & 0x1fffffff);
      uVar8 = (ulong)(((uint)uVar12 * 2 ^ *(uint *)(pGVar1 + -uVar3)) & 0x40000000);
      *(ulong *)pGVar1 = uVar12 & 0xffffffffbfffffff | uVar8;
      *(ulong *)pGVar1 =
           uVar12 & 0xbfffffffbfffffff | uVar8 | *(ulong *)(pGVar1 + -uVar3) & 0x4000000000000000;
      iVar14 = iVar14 + 1;
    }
    iVar14 = iVar5;
  }
  if (iVar14 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x1d2,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  pGVar1 = Gia_ManPo(p,pCex->iPo);
  if ((pGVar1->field_0x3 & 0x40) == 0) {
    __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x1d3,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  printf("Inner states: ");
  Bmc_CexPrint(pCex_00,p->vCis->nSize - p->nRegs,fVerbose);
  printf("Implications: ");
  Bmc_CexPrint(pCex_01,p->vCis->nSize - p->nRegs,fVerbose);
  if (ppCexImpl == (Abc_Cex_t **)0x0) {
    Abc_CexFree(pCex_01);
  }
  else {
    *ppCexImpl = pCex_01;
  }
  return pCex_00;
}

Assistant:

Abc_Cex_t * Bmc_CexInnerStates( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t ** ppCexImpl, int fVerbose )
{
    Abc_Cex_t * pNew, * pNew2;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // start the counter-example
    pNew2 = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew2->iFrame = pCex->iFrame;
    pNew2->iPo    = pCex->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
    {
        pObjRi->fMark0 = 0;
        pObjRi->fMark1 = 1;
    }
    iBit = pCex->nRegs;
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
        }
        Gia_ManForEachCi( p, pObj, k )
        {
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
            if ( pObj->fMark1 )
                Abc_InfoSetBit( pNew2->pData, pNew2->nPis * i + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }

/*
        // print input/state/output
        printf( "%3d : ", i );
        Gia_ManForEachPi( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachPo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( "\n" );
*/
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );

    printf( "Inner states: " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    printf( "Implications: " );
    Bmc_CexPrint( pNew2, Gia_ManPiNum(p), fVerbose );
    if ( ppCexImpl )
        *ppCexImpl = pNew2;
    else
        Abc_CexFree( pNew2 );
    return pNew;
}